

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall google::protobuf::compiler::Parser::Consume(Parser *this,char *text,char *error)

{
  char *__s;
  bool bVar1;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *error_local;
  char *text_local;
  Parser *this_local;
  
  local_28 = error;
  error_local = text;
  text_local = (char *)this;
  bVar1 = TryConsume(this,text);
  __s = local_28;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
    AddError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return bVar1;
}

Assistant:

bool Parser::Consume(const char* text, const char* error) {
  if (TryConsume(text)) {
    return true;
  } else {
    AddError(error);
    return false;
  }
}